

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_comp.c
# Opt level: O1

int avl_comp_uint16(void *k1,void *k2)

{
  int iVar1;
  
  iVar1 = 1;
  if (*k1 <= *k2) {
    iVar1 = -(uint)(*k1 < *k2);
  }
  return iVar1;
}

Assistant:

int
avl_comp_uint16(const void *k1, const void *k2) {
  const uint16_t *u1 = k1;
  const uint16_t *u2 = k2;

  if (*u1 > *u2) {
    return 1;
  }
  if (*u2 > *u1) {
    return -1;
  }
  return 0;
}